

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_int clEnqueueNDRangeKernel
                 (cl_command_queue command_queue,cl_kernel kernel,cl_uint work_dim,
                 size_t *global_work_offset,size_t *global_work_size,size_t *param_6,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  CTracker *pCVar1;
  CLIntercept *this;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  cl_int cVar5;
  cl_int errorCode;
  uint64_t enqueueCounter;
  time_point tVar6;
  time_point tVar7;
  string argsString;
  size_t *local_work_size_local;
  size_t *local_98;
  string hostTag;
  time_point local_70;
  time_point local_68;
  cl_event local_event;
  string deviceTag;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x24;
  }
  if ((g_pIntercept->m_Dispatch).clEnqueueNDRangeKernel == (cl_api_clEnqueueNDRangeKernel)0x0) {
    return -0x24;
  }
  local_work_size_local = param_6;
  local_98 = global_work_offset;
  enqueueCounter = CLIntercept::incrementEnqueueCounter(g_pIntercept);
  if ((this->m_Config).CaptureReplay == true) {
    bVar2 = false;
    if (((this->m_Config).CaptureReplayMinEnqueue <= enqueueCounter) &&
       (bVar2 = false, enqueueCounter <= (this->m_Config).CaptureReplayMaxEnqueue)) {
      bVar2 = CLIntercept::checkCaptureReplayForKernel(this,kernel);
      if ((bVar2) && (bVar2 = CLIntercept::checkCaptureReplayKernelSkips(this,kernel), bVar2)) {
        CLIntercept::startCaptureReplay
                  (this,enqueueCounter,kernel,work_dim,local_98,global_work_size,param_6);
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
    }
  }
  else {
    bVar2 = false;
  }
  if ((this->m_Config).DumpBuffersBeforeEnqueue == true) {
    bVar3 = false;
    if (((this->m_Config).DumpBuffersMinEnqueue <= enqueueCounter) &&
       (bVar3 = false, enqueueCounter <= (this->m_Config).DumpBuffersMaxEnqueue)) {
      bVar3 = CLIntercept::checkDumpBuffersForKernel(this,kernel);
    }
  }
  else {
    bVar3 = false;
  }
  if ((bVar2 | bVar3) == 1) {
    std::__cxx11::string::string((string *)&argsString,"Pre",(allocator *)&hostTag);
    CLIntercept::dumpBuffersForKernel
              (this,&argsString,bVar2,bVar3,enqueueCounter,kernel,command_queue);
    std::__cxx11::string::~string((string *)&argsString);
  }
  if ((this->m_Config).DumpImagesBeforeEnqueue == true) {
    bVar3 = false;
    if (((this->m_Config).DumpImagesMinEnqueue <= enqueueCounter) &&
       (enqueueCounter <= (this->m_Config).DumpImagesMaxEnqueue)) {
      bVar3 = CLIntercept::checkDumpImagesForKernel(this,kernel);
    }
  }
  else {
    bVar3 = false;
  }
  if ((bVar2 | bVar3) == 1) {
    std::__cxx11::string::string((string *)&argsString,"Pre",(allocator *)&hostTag);
    CLIntercept::dumpImagesForKernel
              (this,&argsString,bVar2,bVar3,enqueueCounter,kernel,command_queue);
    std::__cxx11::string::~string((string *)&argsString);
  }
  if ((this->m_Config).InjectBuffers == true) {
    CLIntercept::injectBuffersForKernel(this,enqueueCounter,kernel,command_queue);
  }
  if ((this->m_Config).InjectImages == true) {
    CLIntercept::injectImagesForKernel(this,enqueueCounter,kernel,command_queue);
  }
  if (((((this->m_Config).AubCapture == true) &&
       ((this->m_Config).AubCaptureMinEnqueue <= enqueueCounter)) &&
      (enqueueCounter <= (this->m_Config).AubCaptureMaxEnqueue)) &&
     (bVar3 = CLIntercept::checkAubCaptureKernelSignature
                        (this,kernel,work_dim,global_work_size,local_work_size_local), bVar3)) {
    CLIntercept::startAubCapture
              (this,"clEnqueueNDRangeKernel",enqueueCounter,kernel,work_dim,global_work_size,
               local_work_size_local,command_queue);
  }
  cVar5 = 0;
  if ((this->m_Config).NullEnqueue != false) goto LAB_00120487;
  if ((this->m_Config).NullLocalWorkSize == true) {
    local_work_size_local = (size_t *)0x0;
  }
  CLIntercept::overrideNullLocalWorkSize(this,work_dim,global_work_size,&local_work_size_local);
  argsString._M_dataplus._M_p = (pointer)&argsString.field_2;
  argsString._M_string_length = 0;
  argsString.field_2._M_local_buf[0] = '\0';
  bVar4 = (this->m_Config).CallLogging;
  if ((bool)bVar4 == true) {
    CLIntercept::getEnqueueNDRangeKernelArgsString
              (this,work_dim,local_98,global_work_size,local_work_size_local,&argsString);
    getFormattedEventWaitList_abi_cxx11_(&hostTag,this,num_events_in_wait_list,event_wait_list);
    std::__cxx11::string::append((string *)&argsString);
    std::__cxx11::string::~string((string *)&hostTag);
    bVar4 = (this->m_Config).CallLogging;
  }
  if ((bVar4 & 1) != 0) {
    CLIntercept::callLoggingEnter
              (this,"clEnqueueNDRangeKernel",enqueueCounter,kernel,"queue = %p, kernel = %p, %s",
               command_queue,kernel,argsString._M_dataplus._M_p);
  }
  if ((this->m_Config).EventChecking == true) {
    CLIntercept::checkEventList
              (this,"clEnqueueNDRangeKernel",num_events_in_wait_list,event_wait_list,event);
  }
  hostTag._M_dataplus._M_p = (pointer)&hostTag.field_2;
  hostTag._M_string_length = 0;
  deviceTag._M_dataplus._M_p = (pointer)&deviceTag.field_2;
  deviceTag._M_string_length = 0;
  hostTag.field_2._M_local_buf[0] = '\0';
  deviceTag.field_2._M_local_buf[0] = '\0';
  if ((((this->m_Config).ChromeCallLogging != false) ||
      ((((this->m_Config).HostPerformanceTiming == true &&
        ((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter)) &&
       (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) ||
     ((((bVar4 = (this->m_Config).DevicePerformanceTiming, (bool)bVar4 != false ||
        ((this->m_Config).ITTPerformanceTiming != false)) ||
       (((this->m_Config).ChromePerformanceTiming != false ||
        ((this->m_Config).DevicePerfCounterEventBasedSampling == true)))) &&
      (((this->m_Config).DevicePerformanceTimingMinEnqueue <= enqueueCounter &&
       (enqueueCounter <= (this->m_Config).DevicePerformanceTimingMaxEnqueue)))))) {
    CLIntercept::getTimingTagsKernel
              (this,command_queue,kernel,work_dim,local_98,global_work_size,local_work_size_local,
               &hostTag,&deviceTag);
    bVar4 = (this->m_Config).DevicePerformanceTiming;
  }
  local_event = (cl_event)0x0;
  if (((((bVar4 & 1) == 0) && ((this->m_Config).ITTPerformanceTiming == false)) &&
      ((this->m_Config).ChromePerformanceTiming == false)) &&
     ((this->m_Config).DevicePerfCounterEventBasedSampling != true)) {
    local_68.__d.__r = (duration)0;
    bVar3 = false;
  }
  else {
    local_68.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    bVar3 = event == (cl_event *)0x0;
    if (bVar3) {
      event = &local_event;
    }
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_70.__d.__r = (duration)0;
  }
  else {
    local_70.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  if ((this->m_Config).Emulate_cl_intel_unified_shared_memory == true) {
    CLIntercept::setUSMKernelExecInfo(this,command_queue,kernel);
  }
  if (((this->m_Config).OverrideBuiltinKernels == true) &&
     (cVar5 = CLIntercept::NDRangeBuiltinKernel
                        (this,command_queue,kernel,work_dim,local_98,global_work_size,
                         local_work_size_local,num_events_in_wait_list,event_wait_list,event),
     cVar5 == 0)) {
    cVar5 = 0;
  }
  else {
    cVar5 = (*(this->m_Dispatch).clEnqueueNDRangeKernel)
                      (command_queue,kernel,work_dim,local_98,global_work_size,local_work_size_local
                       ,num_events_in_wait_list,event_wait_list,event);
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    tVar6.__d.__r = (duration)0;
  }
  else {
    tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      CLIntercept::updateHostTimingStats(this,"clEnqueueNDRangeKernel",&hostTag,local_70,tVar6);
    }
  }
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     ((this->m_Config).ChromePerformanceTiming == false)) {
    if ((event != (cl_event *)0x0) &&
       ((this->m_Config).DevicePerfCounterEventBasedSampling != false)) {
LAB_00120303:
      if (((this->m_Config).DevicePerformanceTimingMinEnqueue <= enqueueCounter) &&
         (enqueueCounter <= (this->m_Config).DevicePerformanceTimingMaxEnqueue)) {
        CLIntercept::addTimingEvent
                  (this,"clEnqueueNDRangeKernel",enqueueCounter,local_68,&deviceTag,command_queue,
                   *event);
      }
      if (bVar3) {
        (*(this->m_Dispatch).clReleaseEvent)(*event);
        goto LAB_0012035f;
      }
    }
  }
  else {
    if (event != (cl_event *)0x0) goto LAB_00120303;
LAB_0012035f:
    event = (cl_event *)0x0;
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar4 = (this->m_Config).ErrorAssert;
    if ((bool)bVar4 == false) {
      if ((cVar5 == 0) || ((this->m_Config).NoErrors == false)) goto LAB_001203c9;
    }
    else if (cVar5 == 0) goto LAB_0012039b;
LAB_001203af:
    if ((bVar4 & 1) != 0) {
      raise(5);
    }
    if ((this->m_Config).NoErrors != false) {
      cVar5 = 0;
    }
  }
  else {
    if (cVar5 != 0) {
      CLIntercept::logError(this,"clEnqueueNDRangeKernel",cVar5);
      bVar4 = (this->m_Config).ErrorAssert;
      goto LAB_001203af;
    }
LAB_0012039b:
    cVar5 = 0;
  }
LAB_001203c9:
  if (((event != (cl_event *)0x0) && ((this->m_Config).LeakChecking != false)) &&
     (*event != (cl_event)0x0)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_Events;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit(this,"clEnqueueNDRangeKernel",cVar5,event,(cl_sync_point_khr *)0x0)
    ;
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    CLIntercept::chromeCallLoggingExit
              (this,"clEnqueueNDRangeKernel",&hostTag,true,enqueueCounter,local_70,tVar6);
  }
  if (((event != (cl_event *)0x0) && (*event != (cl_event)0x0)) &&
     (((this->m_Config).ChromeCallLogging != false ||
      ((this->m_Config).ChromePerformanceTiming == true)))) {
    CLIntercept::addEvent(this,*event,enqueueCounter);
  }
  std::__cxx11::string::~string((string *)&deviceTag);
  std::__cxx11::string::~string((string *)&hostTag);
  std::__cxx11::string::~string((string *)&argsString);
LAB_00120487:
  if ((this->m_Config).DumpBuffersAfterEnqueue == true) {
    bVar3 = false;
    if (((this->m_Config).DumpBuffersMinEnqueue <= enqueueCounter) &&
       (enqueueCounter <= (this->m_Config).DumpBuffersMaxEnqueue)) {
      bVar3 = CLIntercept::checkDumpBuffersForKernel(this,kernel);
    }
  }
  else {
    bVar3 = false;
  }
  if ((bVar2 | bVar3) == 1) {
    std::__cxx11::string::string((string *)&argsString,"Post",(allocator *)&hostTag);
    CLIntercept::dumpBuffersForKernel
              (this,&argsString,bVar2,bVar3,enqueueCounter,kernel,command_queue);
    std::__cxx11::string::~string((string *)&argsString);
  }
  if ((this->m_Config).DumpImagesAfterEnqueue == true) {
    bVar3 = false;
    if (((this->m_Config).DumpImagesMinEnqueue <= enqueueCounter) &&
       (enqueueCounter <= (this->m_Config).DumpImagesMaxEnqueue)) {
      bVar3 = CLIntercept::checkDumpImagesForKernel(this,kernel);
    }
  }
  else {
    bVar3 = false;
  }
  if ((bVar2 | bVar3) == 1) {
    std::__cxx11::string::string((string *)&argsString,"Post",(allocator *)&hostTag);
    CLIntercept::dumpImagesForKernel
              (this,&argsString,bVar2,bVar3,enqueueCounter,kernel,command_queue);
    std::__cxx11::string::~string((string *)&argsString);
  }
  if ((this->m_Config).FinishAfterEnqueue == true) {
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar6.__d.__r = (duration)0;
    }
    CLIntercept::logFlushOrFinishAfterEnqueueStart(this,"clFinish","clEnqueueNDRangeKernel");
    errorCode = (*(this->m_Dispatch).clFinish)(command_queue);
    CLIntercept::logFlushOrFinishAfterEnqueueEnd(this,"clFinish","clEnqueueNDRangeKernel",errorCode)
    ;
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar7.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        std::__cxx11::string::string((string *)&argsString,"",(allocator *)&hostTag);
        CLIntercept::updateHostTimingStats(this,"(finish after enqueue)",&argsString,tVar6,tVar7);
        std::__cxx11::string::~string((string *)&argsString);
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        std::__cxx11::string::string((string *)&argsString,"",(allocator *)&hostTag);
        CLIntercept::chromeCallLoggingExit
                  (this,"(finish after enqueue)",&argsString,false,0,tVar6,tVar7);
        std::__cxx11::string::~string((string *)&argsString);
      }
    }
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar6.__d.__r = (duration)0;
    }
    CLIntercept::checkTimingEvents(this);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar7.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        std::__cxx11::string::string((string *)&argsString,"",(allocator *)&hostTag);
        CLIntercept::updateHostTimingStats(this,"(device timing overhead)",&argsString,tVar6,tVar7);
        std::__cxx11::string::~string((string *)&argsString);
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        std::__cxx11::string::string((string *)&argsString,"",(allocator *)&hostTag);
        CLIntercept::chromeCallLoggingExit
                  (this,"(device timing overhead)",&argsString,false,0,tVar6,tVar7);
        std::__cxx11::string::~string((string *)&argsString);
      }
    }
  }
  else if ((this->m_Config).FlushAfterEnqueue == true) {
    (*(this->m_Dispatch).clFlush)(command_queue);
  }
  if (((this->m_Config).AubCapture == true) &&
     ((((this->m_Config).AubCaptureIndividualEnqueues != false ||
       (enqueueCounter < (this->m_Config).AubCaptureMinEnqueue)) ||
      ((this->m_Config).AubCaptureMaxEnqueue < enqueueCounter)))) {
    CLIntercept::stopAubCapture(this,command_queue);
  }
  return cVar5;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clEnqueueNDRangeKernel)(
    cl_command_queue command_queue,
    cl_kernel kernel,
    cl_uint work_dim,
    const size_t* global_work_offset,
    const size_t* global_work_size,
    const size_t* local_work_size,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clEnqueueNDRangeKernel )
    {
        cl_int  retVal = CL_SUCCESS;

        INCREMENT_ENQUEUE_COUNTER();
        CHECK_CAPTURE_REPLAY_START_KERNEL(
            kernel,
            work_dim,
            global_work_offset,
            global_work_size,
            local_work_size );
        DUMP_BUFFERS_BEFORE_ENQUEUE( kernel, command_queue );
        DUMP_IMAGES_BEFORE_ENQUEUE( kernel, command_queue );
        INJECT_MEMORY_OBJECTS( kernel, command_queue );
        CHECK_AUBCAPTURE_START_KERNEL(
            kernel,
            work_dim,
            global_work_size,
            local_work_size,
            command_queue );

        if( pIntercept->config().NullEnqueue == false )
        {
            if( pIntercept->config().NullLocalWorkSize )
            {
                local_work_size = NULL;
            }
            pIntercept->overrideNullLocalWorkSize(
                work_dim,
                global_work_size,
                local_work_size );

            std::string argsString;
            if( pIntercept->config().CallLogging )
            {
                pIntercept->getEnqueueNDRangeKernelArgsString(
                    work_dim,
                    global_work_offset,
                    global_work_size,
                    local_work_size,
                    argsString );
                argsString += getFormattedEventWaitList(
                    pIntercept,
                    num_events_in_wait_list,
                    event_wait_list);
            }
            CALL_LOGGING_ENTER_KERNEL(
                kernel,
                "queue = %p, kernel = %p, %s",
                command_queue,
                kernel,
                argsString.c_str() );

            CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
            GET_TIMING_TAGS_KERNEL(
                command_queue,
                kernel,
                work_dim,
                global_work_offset,
                global_work_size,
                local_work_size );
            DEVICE_PERFORMANCE_TIMING_START( event );
            HOST_PERFORMANCE_TIMING_START();

//            ITT_ADD_PARAM_AS_METADATA(command_queue);
//            ITT_ADD_PARAM_AS_METADATA(kernel);
            ITT_ADD_PARAM_AS_METADATA(work_dim);
            ITT_ADD_ARRAY_PARAM_AS_METADATA(work_dim, global_work_offset);
            ITT_ADD_ARRAY_PARAM_AS_METADATA(work_dim, global_work_size);
            ITT_ADD_ARRAY_PARAM_AS_METADATA(work_dim, local_work_size);
            ITT_ADD_ARRAY_PARAM_AS_METADATA(num_events_in_wait_list, event_wait_list);

            if( pIntercept->config().Emulate_cl_intel_unified_shared_memory )
            {
                pIntercept->setUSMKernelExecInfo(
                    command_queue,
                    kernel );
            }

            retVal = CL_INVALID_OPERATION;

            if( ( retVal != CL_SUCCESS ) &&
                pIntercept->config().OverrideBuiltinKernels )
            {

                retVal = pIntercept->NDRangeBuiltinKernel(
                    command_queue,
                    kernel,
                    work_dim,
                    global_work_offset,
                    global_work_size,
                    local_work_size,
                    num_events_in_wait_list,
                    event_wait_list,
                    event );
            }

            if( retVal != CL_SUCCESS )
            {
                retVal = pIntercept->dispatch().clEnqueueNDRangeKernel(
                    command_queue,
                    kernel,
                    work_dim,
                    global_work_offset,
                    global_work_size,
                    local_work_size,
                    num_events_in_wait_list,
                    event_wait_list,
                    event );
            }

            HOST_PERFORMANCE_TIMING_END_WITH_TAG();
            DEVICE_PERFORMANCE_TIMING_END_WITH_TAG( command_queue, event );
            CHECK_ERROR( retVal );
            ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
            CALL_LOGGING_EXIT_EVENT_WITH_TAG( retVal, event );
            ADD_EVENT( event ? event[0] : NULL );
        }

        DUMP_BUFFERS_AFTER_ENQUEUE( kernel, command_queue );
        DUMP_IMAGES_AFTER_ENQUEUE( kernel, command_queue );
        FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
        CHECK_AUBCAPTURE_STOP( command_queue );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}